

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O2

void __thiscall TPZMHMixedMeshControl::CreateHDivPressureMHMMesh(TPZMHMixedMeshControl *this)

{
  int iVar1;
  TPZGeoMesh *this_00;
  TPZCompMesh *multiphysicsmesh;
  ostream *poVar2;
  TPZManVector<TPZCompMesh_*,_3> cmeshes;
  TPZManVector<TPZCompMesh_*,_3> meshvector;
  
  TPZManVector<TPZCompMesh_*,_3>::TPZManVector(&cmeshes,2);
  *cmeshes.super_TPZVec<TPZCompMesh_*>.fStore = ((this->fFluxMesh).fRef)->fPointer;
  cmeshes.super_TPZVec<TPZCompMesh_*>.fStore[1] =
       ((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer;
  if (1 < (this->super_TPZMHMeshControl).fNState) {
    TPZManVector<TPZCompMesh_*,_3>::Resize(&cmeshes,3);
    cmeshes.super_TPZVec<TPZCompMesh_*>.fStore[2] = ((this->fRotationMesh).fRef)->fPointer;
  }
  this_00 = (*cmeshes.super_TPZVec<TPZCompMesh_*>.fStore)->fReference;
  if (this_00 != (TPZGeoMesh *)0x0) {
    iVar1 = this_00->fDim;
    TPZGeoMesh::ResetReference(this_00);
    multiphysicsmesh = ((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer;
    multiphysicsmesh->fDimModel = iVar1;
    TPZCreateApproximationSpace::SetAllCreateFunctionsMultiphysicElem(&multiphysicsmesh->fCreate);
    BuildMultiPhysicsMesh(this);
    TPZManVector<TPZCompMesh_*,_3>::TPZManVector(&meshvector,0);
    TPZManVector<TPZCompMesh_*,_3>::operator=(&meshvector,&cmeshes);
    TPZMHMeshControl::JoinSubdomains
              (&this->super_TPZMHMeshControl,&meshvector.super_TPZVec<TPZCompMesh_*>,
               multiphysicsmesh);
    TPZBuildMultiphysicsMesh::TransferFromMeshes
              (&meshvector.super_TPZVec<TPZCompMesh_*>,multiphysicsmesh);
    (*(this->super_TPZMHMeshControl)._vptr_TPZMHMeshControl[0x14])
              (this,(ulong)(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fDim - 1));
    (*(this->super_TPZMHMeshControl)._vptr_TPZMHMeshControl[0x14])
              (this,(ulong)(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fDim - 2));
    (**(code **)(*(long *)multiphysicsmesh + 0x88))(multiphysicsmesh);
    TPZManVector<TPZCompMesh_*,_3>::~TPZManVector(&meshvector);
    TPZManVector<TPZCompMesh_*,_3>::~TPZManVector(&cmeshes);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Geometric mesh doesn\'t exist");
  std::endl<char,std::char_traits<char>>(poVar2);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
             ,0x239);
}

Assistant:

void TPZMHMixedMeshControl::CreateHDivPressureMHMMesh()
{
    TPZManVector<TPZCompMesh *,3 > cmeshes(2);
    cmeshes[0] = fFluxMesh.operator->();
    cmeshes[1] = fPressureFineMesh.operator->();
    
    if(0)
    {
        std::ofstream out("PressureMesh_MultiPhis.txt");
        cmeshes[1] ->Print(out);
        
        std::ofstream out2("FluxMesh_MultiPhis.txt");
        cmeshes[0] ->Print(out2);
    }
    
    
    if(fNState > 1) {
        cmeshes.Resize(3);
        cmeshes[2] = fRotationMesh.operator->();
    }
    TPZGeoMesh *gmesh = cmeshes[0]->Reference();
    if(!gmesh)
    {
        std::cout<< "Geometric mesh doesn't exist" << std::endl;
        DebugStop();
    }
    int dim = gmesh->Dimension();
    gmesh->ResetReference();
    // Multiphysics mesh
    TPZCompMesh * MixedFluxPressureCmesh = fCMesh.operator->();
    MixedFluxPressureCmesh->SetDimModel(dim);
    MixedFluxPressureCmesh->SetAllCreateFunctionsMultiphysicElem();
    
    BuildMultiPhysicsMesh();
    TPZManVector<TPZCompMesh * ,3> meshvector;
    
#ifdef PZDEBUG
    if(0)
    {
        std::ofstream out2("gmesh.txt");
        gmesh->Print(out2);
        std::ofstream out3("HDivMesh.txt");
        fFluxMesh->Print(out3);
        std::ofstream out4("PressureMesh.txt");
        fPressureFineMesh->Print(out4);
    }
#endif
    
    meshvector = cmeshes;

    // populate the connect to subdomain data structure for the multiphysics mesh
    JoinSubdomains(meshvector, MixedFluxPressureCmesh);
    
    // Transferindo para a multifisica
//    TPZBuildMultiphysicsMesh::AddElements(meshvector, MixedFluxPressureCmesh);
//    TPZBuildMultiphysicsMesh::AddConnects(meshvector, MixedFluxPressureCmesh);
    // copy the solution of the atomic meshes to the multiphysics mesh
    TPZBuildMultiphysicsMesh::TransferFromMeshes(meshvector, MixedFluxPressureCmesh);

    std::pair<int,int> skelmatid(fSkeletonMatId,fSecondSkeletonMatId);
    CreateMultiPhysicsInterfaceElements(fGMesh->Dimension()-1);
    CreateMultiPhysicsInterfaceElements(fGMesh->Dimension()-2);
#ifdef PZDEBUG
    if(0)
    {
        MixedFluxPressureCmesh->ComputeNodElCon();
        std::ofstream file("cmeshmphys.vtk");
        TPZVTKGeoMesh::PrintCMeshVTK(MixedFluxPressureCmesh, file,true);
        std::ofstream out("cmeshmphys.txt");
        MixedFluxPressureCmesh->Print(out);
    }
#endif
    MixedFluxPressureCmesh->CleanUpUnconnectedNodes();
    
#ifdef PZDEBUG
    if(0)
    {
        std::ofstream out("multiphysics.txt");
        MixedFluxPressureCmesh->Print(out);
    }
#endif
    
    return;
    
}